

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
backend::codegen::Codegen::emit_phi_move
          (Codegen *this,
          unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *i)

{
  uint32_t uVar1;
  uint32_t uVar2;
  OpCode OVar3;
  Reg RVar4;
  _Hash_node_base *p_Var5;
  VarId collapsed;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> local_90;
  _func_int **local_88;
  _func_int **local_80;
  vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
  *local_78;
  VarId local_70;
  VarId local_60;
  undefined **local_50;
  uint32_t local_48;
  uint32_t local_38;
  
  p_Var5 = (i->_M_h)._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    local_78 = (vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                *)&this->inst;
    local_80 = (_func_int **)&PTR_display_001ed930;
    local_88 = (_func_int **)&PTR_display_001ed7c0;
    do {
      uVar1 = *(uint32_t *)&p_Var5[2]._M_nxt;
      local_50 = &PTR_display_001eb100;
      local_48 = uVar1;
      get_collapsed_var((Codegen *)&stack0xffffffffffffffc0,(VarId *)this);
      uVar2 = local_38;
      if (local_38 != uVar1) {
        local_60.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        local_60.id = uVar1;
        OVar3 = get_or_alloc_vgp(this,&local_60);
        local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        local_70.id = uVar2;
        RVar4 = get_or_alloc_vgp(this,&local_70);
        local_90._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
        super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
        super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
             (__uniq_ptr_data<arm::Inst,_std::default_delete<arm::Inst>,_true,_true>)
             operator_new(0x38);
        ((Inst *)((long)local_90._M_t.
                        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                        super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                        super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20))->op = OVar3;
        *(undefined2 *)
         &((Inst *)((long)local_90._M_t.
                          super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                          super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20))->cond = 1;
        ((Inst *)local_90._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                 _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)->op = Mov;
        ((Inst *)local_90._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                 _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                 super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)->cond = Always;
        (((Inst *)local_90._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                  _M_t.super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                  super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl)->super_Displayable).
        _vptr_Displayable = local_80;
        *(Reg *)&(((Inst *)((long)local_90._M_t.
                                  super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                  .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->
                 super_Displayable)._vptr_Displayable = RVar4;
        *(undefined1 *)
         &(((Inst *)((long)local_90._M_t.
                           super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                           super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                           super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30))->
          super_Displayable)._vptr_Displayable = 0;
        (((Inst *)((long)local_90._M_t.
                         super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                         super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                         super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x20))->
        super_Displayable)._vptr_Displayable = local_88;
        *(undefined ***)
         &((Inst *)((long)local_90._M_t.
                          super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
                          super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                          super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))->op =
             &PTR_display_001ed820;
        std::
        vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
        ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                  (local_78,&local_90);
        if (local_90._M_t.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
            super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
            super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>)0x0) {
          (**(code **)(*(long *)local_90._M_t.
                                super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10))();
        }
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Codegen::emit_phi_move(std::unordered_set<mir::inst::VarId>& i) {
  for (auto id : i) {
    auto collapsed = get_collapsed_var(id);
    if (collapsed == id) {
      continue;
    }
    auto src_reg = get_or_alloc_vgp(id);
    // display_reg_name(LOG(DEBUG), src_reg);
    // auto vis = std::set<mir::inst::VarId>();
    // for (auto it = collapsed.first; it != collapsed.second; it++) {
    //   if (vis.find(it->second) != vis.end()) continue;
    //   vis.insert(it->second);
    auto dest_reg = get_or_alloc_vgp(collapsed);
    inst.push_back(std::make_unique<Arith2Inst>(OpCode::Mov, dest_reg,
                                                RegisterOperand(src_reg)));
    // }
  }
}